

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

uint32_t peparse::calculateRichChecksum(bounded_buffer *b,pe_header *p)

{
  rich_entry rVar1;
  bool bVar2;
  uint32_t uVar3;
  reference prVar4;
  long in_RSI;
  long *in_RDI;
  uint32_t num;
  rich_entry entry;
  iterator __end1;
  iterator __begin1;
  vector<peparse::rich_entry,_std::allocator<peparse::rich_entry>_> *__range1;
  uint8_t i;
  uint32_t checksum;
  vector<peparse::rich_entry,_std::allocator<peparse::rich_entry>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  uint16_t local_38;
  uint16_t uStack_36;
  uint uStack_34;
  __normal_iterator<peparse::rich_entry_*,_std::vector<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>_>
  local_28;
  long local_20;
  byte local_15;
  int local_14;
  long local_10;
  long *local_8;
  
  local_14 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_15 = 0; local_15 < 0x80; local_15 = local_15 + 1) {
    if ((local_15 < 0x3c) || (0x3f < local_15)) {
      uVar3 = rol((uint)*(byte *)(*local_8 + (ulong)local_15),local_15 & 0x1f);
      local_14 = uVar3 + local_14;
    }
  }
  local_20 = local_10 + 0x48;
  local_28._M_current =
       (rich_entry *)
       std::vector<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>::begin
                 (in_stack_ffffffffffffffb8);
  std::vector<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>::end
            (in_stack_ffffffffffffffb8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<peparse::rich_entry_*,_std::vector<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (__normal_iterator<peparse::rich_entry_*,_std::vector<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>_>
                             *)in_stack_ffffffffffffffb8), bVar2) {
    prVar4 = __gnu_cxx::
             __normal_iterator<peparse::rich_entry_*,_std::vector<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>_>
             ::operator*(&local_28);
    rVar1 = *prVar4;
    local_38 = rVar1.ProductId;
    uStack_36 = rVar1.BuildNumber;
    in_stack_ffffffffffffffc4 = CONCAT22(local_38,uStack_36);
    uStack_34 = rVar1.Count;
    uVar3 = rol(in_stack_ffffffffffffffc4,uStack_34 & 0x1f);
    local_14 = uVar3 + local_14;
    __gnu_cxx::
    __normal_iterator<peparse::rich_entry_*,_std::vector<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>_>
    ::operator++(&local_28);
  }
  return local_14 + 0x80;
}

Assistant:

std::uint32_t calculateRichChecksum(const bounded_buffer *b, pe_header &p) {

  // First, calculate the sum of the DOS header bytes each rotated left the
  // number of times their position relative to the start of the DOS header e.g.
  // second byte is rotated left 2x using rol operation
  std::uint32_t checksum = 0;

  for (uint8_t i = 0; i < RICH_OFFSET; i++) {

    // skip over dos e_lfanew field at offset 0x3C
    if (i >= 0x3C && i <= 0x3F) {
      continue;
    }
    checksum += rol(b->buf[i], i & 0x1F);
  }

  // Next, take summation of each Rich header entry by combining its ProductId
  // and BuildNumber into a single 32 bit number and rotating by its count.
  for (rich_entry entry : p.rich.Entries) {
    std::uint32_t num =
        static_cast<std::uint32_t>((entry.ProductId << 16) | entry.BuildNumber);
    checksum += rol(num, entry.Count & 0x1F);
  }

  checksum += RICH_OFFSET;

  return checksum;
}